

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

void __thiscall slang::ast::ClockingSkew::serializeTo(ClockingSkew *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  if (this->edge != None) {
    sVar1 = ast::toString(this->edge);
    ASTSerializer::write(serializer,4,"edge",sVar1._M_len);
  }
  if (this->delay != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)this->delay);
    return;
  }
  return;
}

Assistant:

void ClockingSkew::serializeTo(ASTSerializer& serializer) const {
    if (edge != EdgeKind::None)
        serializer.write("edge", toString(edge));
    if (delay)
        serializer.write("delay", *delay);
}